

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O1

int lj_cf_coroutine_create(lua_State *L)

{
  TValue *pTVar1;
  lua_State *plVar2;
  
  if ((L->base < L->top) && ((L->base->field_4).it >> 0xf == 0x1fff7)) {
    plVar2 = lua_newthread(L);
    pTVar1 = plVar2->top;
    plVar2->top = pTVar1 + 1;
    pTVar1->u64 = L->base->u64 & 0x7fffffffffff | 0xfffb800000000000;
    return 1;
  }
  lj_err_argt(L,1,6);
}

Assistant:

LJLIB_CF(coroutine_create)
{
  lua_State *L1;
  if (!(L->base < L->top && tvisfunc(L->base)))
    lj_err_argt(L, 1, LUA_TFUNCTION);
  L1 = lua_newthread(L);
  setfuncV(L, L1->top++, funcV(L->base));
  return 1;
}